

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandPrintStatus(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Cex_t *pAVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Abc_Ntk_t *pNtk;
  FILE *__s;
  Vec_Ptr_t *pVVar5;
  Vec_Int_t *pVVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  size_t __size;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  char *local_40;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  local_40 = (char *)0x0;
  Extra_UtilGetoptReset();
  bVar3 = true;
  bVar2 = false;
  while( true ) {
    while (iVar4 = Extra_UtilGetopt(argc,argv,"Losh"), iVar4 == 0x6f) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    if (iVar4 == -1) break;
    if (iVar4 == 0x73) {
      bVar3 = (bool)(bVar3 ^ 1);
    }
    else {
      if (iVar4 != 0x4c) goto LAB_0024cf4e;
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by a file name.\n");
LAB_0024cf4e:
        Abc_Print(-2,"usage: print_status [-L file] [-osh]\n");
        Abc_Print(-2,"\t          prints verification status\n");
        pcVar8 = "no logging";
        if (local_40 != (char *)0x0) {
          pcVar8 = local_40;
        }
        Abc_Print(-2,"\t-L file : the log file name [default = %s]\n",pcVar8);
        pcVar9 = "yes";
        pcVar8 = "yes";
        if (!bVar2) {
          pcVar8 = "no";
        }
        Abc_Print(-2,"\t-o      : toggle printing output status [default = %s]\n",pcVar8);
        if (!bVar3) {
          pcVar9 = "no";
        }
        Abc_Print(-2,"\t-s      : toggle using short print-out [default = %s]\n",pcVar9);
        pcVar8 = "\t-h      : print the command usage\n";
        iVar4 = -2;
LAB_0024cff0:
        Abc_Print(iVar4,pcVar8);
        return 1;
      }
      local_40 = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
    }
  }
  if (bVar2) {
    if (pNtk != (Abc_Ntk_t *)0x0) {
      Abc_NtkPrintPoEquivs(pNtk);
      return 0;
    }
    pcVar8 = "Empty network.\n";
    iVar4 = -1;
    goto LAB_0024cff0;
  }
  if (pAbc->vStatuses == (Vec_Int_t *)0x0) {
    Abc_Print(1,"Status = %d  Frames = %d   ",(ulong)(uint)pAbc->Status,(ulong)(uint)pAbc->nFrames);
  }
  if (pAbc->pCex == (Abc_Cex_t *)0x0) {
    if (pAbc->vCexVec == (Vec_Ptr_t *)0x0) {
      Abc_Print(1,"Cex is not defined.\n");
      goto LAB_0024cd20;
    }
  }
  else {
    Abc_CexPrintStats(pAbc->pCex);
  }
  if ((pAbc->vCexVec != (Vec_Ptr_t *)0x0) && (pVVar5 = pAbc->vCexVec, 0 < pVVar5->nSize)) {
    lVar13 = 0;
    uVar10 = 0;
    do {
      pAVar1 = (Abc_Cex_t *)pVVar5->pArray[lVar13];
      if ((Abc_Cex_t *)0x1 < pAVar1) {
        uVar10 = uVar10 + 1;
        printf("%4d : ",(ulong)uVar10);
        Abc_CexPrintStats(pAVar1);
      }
      lVar13 = lVar13 + 1;
      pVVar5 = pAbc->vCexVec;
    } while (lVar13 < pVVar5->nSize);
  }
LAB_0024cd20:
  pVVar6 = pAbc->vStatuses;
  if (pVVar6 != (Vec_Int_t *)0x0) {
    if (local_40 == (char *)0x0) {
      if (bVar3) {
        iVar4 = pVVar6->nSize;
        lVar13 = (long)iVar4;
        uVar14 = 0;
        uVar11 = 0;
        if (0 < lVar13) {
          lVar12 = 0;
          uVar11 = 0;
          do {
            uVar11 = (ulong)((int)uVar11 + (uint)(pVVar6->pArray[lVar12] == 0));
            lVar12 = lVar12 + 1;
          } while (lVar13 != lVar12);
        }
        if (0 < iVar4) {
          lVar12 = 0;
          uVar14 = 0;
          do {
            uVar14 = (ulong)((int)uVar14 + (uint)(pVVar6->pArray[lVar12] == 1));
            lVar12 = lVar12 + 1;
          } while (lVar13 != lVar12);
        }
        if (iVar4 < 1) {
          uVar7 = 0;
        }
        else {
          lVar12 = 0;
          uVar7 = 0;
          do {
            uVar7 = (ulong)((int)uVar7 + (uint)(pVVar6->pArray[lVar12] == -1));
            lVar12 = lVar12 + 1;
          } while (lVar13 != lVar12);
        }
        printf("Status array contains %d SAT, %d UNSAT, and %d UNDEC entries (out of %d).",uVar11,
               uVar14,uVar7);
      }
      else {
        pVVar6 = pAbc->vStatuses;
        if (0 < pVVar6->nSize) {
          uVar14 = 0;
          do {
            printf("%d=%d  ",uVar14 & 0xffffffff,(ulong)(uint)pVVar6->pArray[uVar14]);
            uVar14 = uVar14 + 1;
            pVVar6 = pAbc->vStatuses;
          } while ((long)uVar14 < (long)pVVar6->nSize);
        }
      }
    }
    else {
      __s = fopen(local_40,"wb");
      if (__s == (FILE *)0x0) {
        printf("Cannot open file \"%s\" for writing.\n",local_40);
      }
      else {
        pVVar5 = pAbc->vCexVec;
        if (0 < pVVar5->nSize) {
          lVar13 = 0;
          do {
            if (pAbc->vStatuses->nSize <= lVar13) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            pAVar1 = (Abc_Cex_t *)pVVar5->pArray[lVar13];
            iVar4 = pAbc->vStatuses->pArray[lVar13];
            if (iVar4 == 1) {
              __size = 0xe;
              pcVar8 = "STATUS: UNSAT ";
LAB_0024cddb:
              fwrite(pcVar8,__size,1,__s);
            }
            else {
              if (iVar4 == 0) {
                __size = 0xc;
                pcVar8 = "STATUS: SAT ";
                goto LAB_0024cddb;
              }
              if (iVar4 == -1) {
                __size = 0x10;
                pcVar8 = "STATUS: ABORTED ";
                goto LAB_0024cddb;
              }
            }
            if (pNtk->vPos->nSize <= lVar13) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pcVar8 = Abc_ObjName((Abc_Obj_t *)pNtk->vPos->pArray[lVar13]);
            fprintf(__s,"%s\n",pcVar8);
            if (iVar4 == 0) {
              Abc_NtkDumpOneCexSpecial((FILE *)__s,pNtk,pAVar1);
            }
            lVar13 = lVar13 + 1;
            pVVar5 = pAbc->vCexVec;
          } while (lVar13 < pVVar5->nSize);
        }
        fclose(__s);
      }
      if (__s == (FILE *)0x0) {
        return 0;
      }
    }
    putchar(10);
  }
  return 0;
}

Assistant:

int Abc_CommandPrintStatus( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Abc_NtkDumpOneCexSpecial( FILE * pFile, Abc_Ntk_t * pNtk, Abc_Cex_t * pCex );
    extern void Abc_NtkPrintPoEquivs( Abc_Ntk_t * pNtk );
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c, fOutStatus = 0, fShort = 1;
    char * pLogFileName = NULL;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Losh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by a file name.\n" );
                goto usage;
            }
            pLogFileName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'o':
            fOutStatus ^= 1;
            break;
        case 's':
            fShort ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( fOutStatus )
    {
        if ( pNtk == NULL )
        {
            Abc_Print( -1, "Empty network.\n" );
            return 1;
        }
        Abc_NtkPrintPoEquivs( pNtk );
        return 0;
    }
    if ( !pAbc->vStatuses )
        Abc_Print( 1,"Status = %d  Frames = %d   ", pAbc->Status, pAbc->nFrames );
    if ( pAbc->pCex == NULL && pAbc->vCexVec == NULL )
        Abc_Print( 1,"Cex is not defined.\n" );
    else
    {
        if ( pAbc->pCex )
            Abc_CexPrintStats( pAbc->pCex );
        if ( pAbc->vCexVec )
        {
            Abc_Cex_t * pTemp;
            int nCexes = 0;
            int Counter = 0;
            //printf( "\n" );
            Vec_PtrForEachEntry( Abc_Cex_t *, pAbc->vCexVec, pTemp, c )
            {
                if ( pTemp == (void *)(ABC_PTRINT_T)1 )
                {
                    Counter++;
                    continue;
                }
                if ( pTemp )
                {
                    printf( "%4d : ", ++nCexes );
                    Abc_CexPrintStats( pTemp );
                }
            }
//            if ( Counter )
//                printf( "In total, %d (out of %d) outputs are \"sat\" but CEXes are not recorded.\n", Counter, Vec_PtrSize(pAbc->vCexVec) );
        }
    }
    if ( pAbc->vStatuses )
    {
        if ( pLogFileName )
        {
            Abc_Cex_t * pTemp = NULL;
            FILE * pFile = fopen( pLogFileName, "wb" );
            if ( pFile == NULL )
            {
                printf( "Cannot open file \"%s\" for writing.\n", pLogFileName );
                return 0;
            }
            Vec_PtrForEachEntry( Abc_Cex_t *, pAbc->vCexVec, pTemp, c )
            {
                int Status = Vec_IntEntry( pAbc->vStatuses, c );
                if ( Status == -1 ) // undec
                    fprintf( pFile, "STATUS: ABORTED " );
                else if ( Status == 0 )
                    fprintf( pFile, "STATUS: SAT " );
                else if ( Status == 1 )
                    fprintf( pFile, "STATUS: UNSAT " );
                fprintf( pFile, "%s\n", Abc_ObjName(Abc_NtkPo(pNtk, c)) );
                if ( Status != 0 )
                    continue;
                Abc_NtkDumpOneCexSpecial( pFile, pNtk, pTemp );
            }
            fclose( pFile );
        }
        else if ( fShort )
        {
            printf( "Status array contains %d SAT, %d UNSAT, and %d UNDEC entries (out of %d).",
                Vec_IntCountEntry(pAbc->vStatuses, 0), Vec_IntCountEntry(pAbc->vStatuses, 1),
                Vec_IntCountEntry(pAbc->vStatuses, -1), Vec_IntSize(pAbc->vStatuses) );
        }
        else
        {
            int i, Entry;
            Vec_IntForEachEntry( pAbc->vStatuses, Entry, i )
                printf( "%d=%d  ", i, Entry );
        }
        printf( "\n" );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: print_status [-L file] [-osh]\n" );
    Abc_Print( -2, "\t          prints verification status\n" );
    Abc_Print( -2, "\t-L file : the log file name [default = %s]\n",  pLogFileName ? pLogFileName : "no logging" );
    Abc_Print( -2, "\t-o      : toggle printing output status [default = %s]\n", fOutStatus? "yes": "no" );
    Abc_Print( -2, "\t-s      : toggle using short print-out [default = %s]\n", fShort? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}